

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O1

Option<const_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_&> __thiscall
Lib::
Map<const_Kernel::FuncTerm_*,_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
::tryGet(Map<const_Kernel::FuncTerm_*,_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
         *this,FuncTerm **key)

{
  FuncId *this_00;
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined8 *in_RDX;
  FuncTerm *pFVar5;
  Stack<Kernel::PolyNf> *pSVar6;
  
  this_00 = (FuncId *)*in_RDX;
  uVar3 = Kernel::FuncId::defaultHash(this_00);
  uVar4 = StackHash<Lib::StlHash>::hash<Kernel::PolyNf>
                    ((Stack<Kernel::PolyNf> *)(this_00 + 1),0x811c9dc5);
  uVar3 = (uVar3 >> 2) + uVar3 * 0x40 + uVar4 + 0x9e3779b9 ^ uVar3;
  uVar3 = uVar3 + (uVar3 == 0);
  uVar1 = (ulong)uVar3 % (ulong)*(uint *)key;
  uVar4 = (&key[1]->_fun)[uVar1 * 2]._num;
  if (uVar4 != 0) {
    pFVar5 = (FuncTerm *)(&key[1]->_fun + uVar1 * 2);
    do {
      if (uVar4 == uVar3) {
        bVar2 = Kernel::operator==((FuncTerm *)(pFVar5->_fun)._typeArgs,(FuncTerm *)*in_RDX);
        if (bVar2) {
          pSVar6 = &pFVar5->_args;
          goto LAB_004a73c2;
        }
      }
      pFVar5 = (FuncTerm *)&(pFVar5->_args)._cursor;
      if (pFVar5 == key[2]) {
        pFVar5 = key[1];
      }
      uVar4 = (pFVar5->_fun)._num;
    } while (uVar4 != 0);
  }
  this->_capacity = 0;
  this->_noOfEntries = 0;
  pSVar6 = (Stack<Kernel::PolyNf> *)0x0;
LAB_004a73c2:
  *(Stack<Kernel::PolyNf> **)this = pSVar6;
  return (OptionBase<const_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_&>)
         (OptionBase<const_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_&>)this;
}

Assistant:

Option<Val const&> tryGet(Key const& key) const
  {
    using Opt = Option<Val const&>;

    auto code = hashCode(key);
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return Opt(entry->value());
      }
    }

    return Opt();
  }